

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O3

FieldDecorationsIter __thiscall
spvtools::val::ValidationState_t::id_member_decorations
          (ValidationState_t *this,uint32_t id,uint32_t member_index)

{
  bool bVar1;
  less<spvtools::val::Decoration> *this_00;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  const_iterator cVar4;
  FieldDecorationsIter FVar5;
  Decoration max_decoration;
  Decoration min_decoration;
  uint32_t local_9c;
  Decoration local_98;
  Decoration local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_9c = id;
  this_00 = (less<spvtools::val::Decoration> *)
            std::
            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
            ::operator[](&this->id_decorations_,&local_9c);
  local_98._0_8_ = (pointer)0x0;
  local_98.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.dec_type_ = DecorationRelaxedPrecision;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_70.params_,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98);
  local_70.struct_member_index_ = member_index;
  if ((pointer)local_98._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._0_8_,
                    (long)local_98.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - local_98._0_8_);
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.dec_type_ = 0x7fffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98.params_,&local_48);
  local_98.struct_member_index_ = member_index;
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  p_Var2 = *(_Base_ptr *)(this_00 + 0x10);
  cVar3._M_node = (_Base_ptr)(this_00 + 8);
  cVar4._M_node = cVar3._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      bVar1 = std::less<spvtools::val::Decoration>::operator()
                        (this_00,(Decoration *)(p_Var2 + 1),&local_70);
      if (!bVar1) {
        cVar4._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar1];
    } while (p_Var2 != (_Base_ptr)0x0);
    p_Var2 = *(_Base_ptr *)(this_00 + 0x10);
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        bVar1 = std::less<spvtools::val::Decoration>::operator()
                          (this_00,&local_98,(Decoration *)(p_Var2 + 1));
        if (bVar1) {
          cVar3._M_node = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[!bVar1];
      } while (p_Var2 != (_Base_ptr)0x0);
    }
  }
  if (local_98.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  FVar5.end._M_node = cVar3._M_node;
  FVar5.begin._M_node = cVar4._M_node;
  return FVar5;
}

Assistant:

FieldDecorationsIter id_member_decorations(uint32_t id,
                                             uint32_t member_index) {
    const auto& decorations = id_decorations_[id];

    // The decorations are sorted by member_index, so this look up will give the
    // exact range of decorations for this member index.
    Decoration min_decoration((spv::Decoration)0, {}, member_index);
    Decoration max_decoration(spv::Decoration::Max, {}, member_index);

    FieldDecorationsIter result;
    result.begin = decorations.lower_bound(min_decoration);
    result.end = decorations.upper_bound(max_decoration);

    return result;
  }